

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::resize(TutorialApplication *this,uint width,uint height)

{
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  size_t in_RDI;
  
  if (((in_ESI != *(int *)(in_RDI + 0x120)) || (in_EDX != *(int *)(in_RDI + 0x124))) ||
     (*(long *)(in_RDI + 0x128) == 0)) {
    *(int *)(in_RDI + 0x120) = in_ESI;
    *(int *)(in_RDI + 0x124) = in_EDX;
    if (*(long *)(in_RDI + 0x128) != 0) {
      alignedUSMFree((void *)0x140ad8);
    }
    pvVar1 = alignedUSMMalloc(CONCAT44(in_ESI,in_EDX),in_RDI,DEFAULT);
    *(void **)(in_RDI + 0x128) = pvVar1;
  }
  return;
}

Assistant:

void TutorialApplication::resize(unsigned width, unsigned height)
  {
    if (width == this->width && height == this->height && pixels)
      return;

    this->width = width;
    this->height = height;
      
    if (pixels) alignedUSMFree(pixels);
    pixels = (unsigned*) alignedUSMMalloc(width*height*sizeof(unsigned),64,EmbreeUSMMode::DEVICE_READ_WRITE);
  }